

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

bool __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::triangleOrder
          (CullingTestInstance *this,Vec4 *v0,Vec4 *v1,Vec4 *v2)

{
  float fVar1;
  int i;
  long lVar2;
  Vec2 s2;
  Vec2 s1;
  Vec2 s0;
  undefined8 local_8;
  
  s1.m_data = (float  [2])
              (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance;
  fVar1 = *(float *)((long)&(this->super_BaseRenderingTestInstance).super_TestInstance.m_context + 4
                    );
  s0.m_data[0] = 0.0;
  s0.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    s0.m_data[lVar2] = s1.m_data[lVar2] / fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  s2.m_data = *(float (*) [2])v0->m_data;
  fVar1 = v0->m_data[3];
  s1.m_data[0] = 0.0;
  s1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    s1.m_data[lVar2] = s2.m_data[lVar2] / fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_8 = *(undefined8 *)v1->m_data;
  fVar1 = v1->m_data[3];
  s2.m_data[0] = 0.0;
  s2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    s2.m_data[lVar2] = *(float *)((long)&local_8 + lVar2 * 4) / fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return 0.0 < (s2.m_data[1] - s0.m_data[1]) * (s1.m_data[0] - s0.m_data[0]) -
               (s1.m_data[1] - s0.m_data[1]) * (s2.m_data[0] - s0.m_data[0]);
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }